

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanomsg_source.cc
# Opt level: O0

void __thiscall
Nanomsg::start(Nanomsg *this,
              shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
              *queue)

{
  native_handle_type __target_thread;
  shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  *in_RDI;
  Nanomsg **unaff_retaddr;
  type *in_stack_00000008;
  thread *in_stack_00000010;
  shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  *in_stack_ffffffffffffffd0;
  shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  *this_00;
  
  std::shared_ptr<Queue<std::vector<std::complex<float>,_std::allocator<std::complex<float>_>_>_>_>
  ::operator=(in_stack_ffffffffffffffd0,in_RDI);
  this_00 = in_RDI;
  std::thread::thread<void(Nanomsg::*)(),Nanomsg*,void>
            (in_stack_00000010,in_stack_00000008,unaff_retaddr);
  std::thread::operator=((thread *)this_00,(thread *)in_RDI);
  std::thread::~thread((thread *)0x1c0633);
  __target_thread = std::thread::native_handle((thread *)(in_RDI + 1));
  pthread_setname_np(__target_thread,"nanomsg");
  return;
}

Assistant:

void Nanomsg::start(const std::shared_ptr<Queue<Samples> >& queue) {
  queue_ = queue;
  thread_ = std::thread(&Nanomsg::loop, this);
#ifdef __APPLE__
  pthread_setname_np("nanomsg");
#else
  pthread_setname_np(thread_.native_handle(), "nanomsg");
#endif
}